

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall
amrex::DeriveRec::getRange(DeriveRec *this,int k,int *state_indx,int *src_comp,int *num_comp)

{
  StateRange *r;
  int *num_comp_local;
  int *src_comp_local;
  int *state_indx_local;
  int k_local;
  DeriveRec *this_local;
  
  k_local = k;
  for (r = this->rng; r != (StateRange *)0x0 && 0 < k_local; r = r->next) {
    k_local = k_local + -1;
  }
  if (r != (StateRange *)0x0) {
    *state_indx = r->typ;
    *src_comp = r->sc;
    *num_comp = r->nc;
  }
  return;
}

Assistant:

void
DeriveRec::getRange (int  k,
                     int& state_indx,
                     int& src_comp,
                     int& num_comp) const
{
    StateRange* r;

    for (r = rng; r != 0 && k > 0; k--, r = r->next)
        ;
    BL_ASSERT(r != 0);
    if (r != 0) {
        state_indx = r->typ;
        src_comp   = r->sc;
        num_comp   = r->nc;
    }
}